

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_module.cpp
# Opt level: O2

int main(void)

{
  element_type *peVar1;
  shared_ptr<vmips::Function> f;
  shared_ptr<vmips::VirtReg> waddr;
  shared_ptr<vmips::VirtReg> size;
  shared_ptr<vmips::VirtReg> fd;
  shared_ptr<vmips::Function> write;
  shared_ptr<vmips::VirtReg> addr;
  shared_ptr<vmips::Data> greetings;
  shared_ptr<vmips::Function> free;
  shared_ptr<vmips::Function> memcpy;
  shared_ptr<vmips::Function> malloc;
  char data [15];
  __weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2> local_188 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_180;
  __weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2> local_178 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_170;
  __weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2> local_168 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_160;
  __weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2> local_158 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_150;
  __weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2> local_148 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_140;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  Module module;
  
  std::__cxx11::string::string(local_98,"test",(allocator *)&write);
  vmips::Module::Module(&module,local_98);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::string(local_b8,"write",(allocator *)&malloc);
  vmips::Module::create_extern(&write,&module,local_b8,3);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::string(local_d8,"malloc",(allocator *)&memcpy);
  vmips::Module::create_extern(&malloc,&module,local_d8,1);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::string(local_f8,"memcpy",(allocator *)&free);
  vmips::Module::create_extern(&memcpy,&module,local_f8,3);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::string(local_118,"free",(allocator *)&f);
  vmips::Module::create_extern(&free,&module,local_118,1);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::string(local_138,"main",(allocator *)&greetings);
  vmips::Module::create_function(&f,&module,local_138,3);
  std::__cxx11::string::~string(local_138);
  vmips::Function::create_data<vmips::asciiz,char(&)[15]>
            ((Function *)&greetings,
             SUB81(f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0),
             (char (*) [15])0x1);
  fd.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0xf;
  vmips::Function::append<vmips::li,unsigned_long>
            ((Function *)&size,
             (unsigned_long *)
             f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  waddr.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  vmips::Function::append<vmips::li,int>
            ((Function *)&fd,
             (int *)f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  vmips::Function::append<vmips::la,std::shared_ptr<vmips::Data>&>
            ((Function *)&waddr,
             (shared_ptr<vmips::Data> *)
             f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<vmips::Function,void>
            (local_148,&write.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>);
  vmips::Function::
  call_void<std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (peVar1,(weak_ptr<vmips::Function> *)local_148,&fd,&waddr,&size);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_140);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<vmips::Function,void>
            (local_158,&malloc.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>);
  vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&addr,(weak_ptr<vmips::Function> *)peVar1,
             (shared_ptr<vmips::VirtReg> *)local_158);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_150);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<vmips::Function,void>
            (local_168,&memcpy.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>);
  vmips::Function::
  call_void<std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (peVar1,(weak_ptr<vmips::Function> *)local_168,&addr,&waddr,&size);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_160);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<vmips::Function,void>
            (local_178,&write.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>);
  vmips::Function::
  call_void<std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (peVar1,(weak_ptr<vmips::Function> *)local_178,&fd,&waddr,&size);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_170);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<vmips::Function,void>
            (local_188,&free.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>);
  vmips::Function::call_void<std::shared_ptr<vmips::VirtReg>&>
            (peVar1,(weak_ptr<vmips::Function> *)local_188,&addr);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_180);
  vmips::Function::assign_special
            ((SpecialReg)f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr,2)
  ;
  vmips::Module::finalize(&module);
  vmips::Module::output((ostream *)&module);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&addr.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&waddr.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fd.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&size.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&greetings.super___shared_ptr<vmips::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&free.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&memcpy.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&malloc.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&write.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vmips::Module::~Module(&module);
  return 0;
}

Assistant:

int main() {
    char data[] = "hello, world!\n";
    auto module = Module("test");
    auto write = module.create_extern("write", 3);
    auto malloc = module.create_extern("malloc", 1);
    auto memcpy = module.create_extern("memcpy", 3);
    auto free = module.create_extern("free", 1);
    auto f = module.create_function("main", 3);
    auto greetings = f->create_data<asciiz>(true, data );
    auto size = f->append<li>(sizeof(data));
    auto fd = f->append<li>(0);
    auto waddr = f->append<la>(greetings);
    f->call_void(write, fd, waddr, size);
    auto addr = f->call(malloc, size);
    f->call_void(memcpy, addr, waddr, size);
    f->call_void(write, fd, waddr, size);
    f->call_void(free, addr);
    f->assign_special(SpecialReg::v0, 0);
    module.finalize();
    module.output(std::cout);
}